

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O0

int ifstream_readBinaryFile(ifstream_t *self,char *filename)

{
  uint8_t *__ptr;
  FILE *__stream;
  size_t sVar1;
  int *piVar2;
  size_t len;
  FILE *fh;
  char *chunk;
  uint32_t chunkLen;
  char *filename_local;
  ifstream_t *self_local;
  
  if ((self == (ifstream_t *)0x0) || (filename == (char *)0x0)) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    __ptr = (uint8_t *)malloc(0x2000);
    if ((__ptr != (uint8_t *)0x0) && (__stream = fopen(filename,"r"), __stream != (FILE *)0x0)) {
      if ((self->handler).open != (_func_void_void_ptr *)0x0) {
        (*(self->handler).open)((self->handler).arg);
      }
      do {
        do {
          sVar1 = fread(__ptr,1,0x2000,__stream);
        } while (sVar1 == 0);
        if ((self->handler).write != (_func_void_void_ptr_uint8_t_ptr_uint32_t *)0x0) {
          (*(self->handler).write)((self->handler).arg,__ptr,(uint32_t)sVar1);
        }
      } while (0x1fff < sVar1);
      if ((self->handler).close != (_func_void_void_ptr *)0x0) {
        (*(self->handler).close)((self->handler).arg);
      }
      if (__ptr != (uint8_t *)0x0) {
        free(__ptr);
      }
      fclose(__stream);
      return 0;
    }
    if (__ptr != (uint8_t *)0x0) {
      free(__ptr);
    }
  }
  return -1;
}

Assistant:

int ifstream_readBinaryFile(ifstream_t *self,const char *filename)
{
   if( (self != 0) && (filename != 0) ){
      uint32_t chunkLen = 0;
      char *chunk;
      chunk = (char*) malloc(IFSTREAM_BLOCK_SIZE);
      if( chunk != 0 ){
         FILE* fh = fopen(filename,"r");
         if (fh != 0){
            if(self->handler.open != 0){
               self->handler.open(self->handler.arg);
            }
            while(1){
               size_t len = fread(&chunk[0], 1, IFSTREAM_BLOCK_SIZE, fh);
               if (len > 0)
               {
                  chunkLen = (uint32_t) len;
                  if(self->handler.write != 0){
                     self->handler.write(self->handler.arg,(uint8_t*)chunk, chunkLen);
                  }
                  if (len < IFSTREAM_BLOCK_SIZE)
                  {
                     break; //done
                  }
               }
            }
            if(self->handler.close != 0){
               self->handler.close(self->handler.arg);
            }
            if (chunk != 0) free(chunk);
            fclose(fh);
            return 0;
         }
      }
      if (chunk != 0) free(chunk);
   }
   else{
      errno = EINVAL;
   }
   return -1;
}